

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O3

int mg_session_read_bool(mg_session *session,int *value)

{
  int iVar1;
  undefined8 in_RAX;
  uint8_t marker;
  uint8_t local_11;
  
  local_11 = (uint8_t)((ulong)in_RAX >> 0x38);
  iVar1 = mg_session_read_uint8(session,&local_11);
  if (iVar1 == 0) {
    if (local_11 == 0xc3) {
      *value = 1;
    }
    else {
      if (local_11 != 0xc2) {
        mg_session_set_error(session,"wrong value marker");
        return -6;
      }
      *value = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mg_session_read_bool(mg_session *session, int *value) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));

  switch (marker) {
    case MG_MARKER_BOOL_FALSE:
      *value = 0;
      return 0;
    case MG_MARKER_BOOL_TRUE:
      *value = 1;
      return 0;
  }

  mg_session_set_error(session, "wrong value marker");
  return MG_ERROR_DECODING_FAILED;
}